

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [15];
  undefined1 auVar16 [13];
  undefined1 auVar17 [15];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [13];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [11];
  undefined1 auVar29 [13];
  undefined1 auVar30 [14];
  undefined1 auVar31 [13];
  undefined1 auVar32 [15];
  undefined1 auVar33 [11];
  undefined1 auVar34 [13];
  undefined1 auVar35 [14];
  undefined1 auVar36 [13];
  uint5 uVar37;
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [13];
  uint6 uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  bool bVar48;
  uchar uVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  size_t sVar53;
  char *pcVar54;
  ostream *poVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  byte bVar66;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ushort uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int pitch;
  void *m_pixels;
  SDL_Event event;
  CHIP8 emulator;
  uint pixels [2048];
  int local_38d4;
  ulong local_38d0;
  void *local_38c8;
  int local_38c0 [5];
  uint local_38ac;
  CHIP8 local_3884;
  string local_2038 [256];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No ROM specified!\nUsage:\t",0x19);
    pcVar54 = *argv;
    if (pcVar54 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107198);
    }
    else {
      sVar53 = strlen(pcVar54);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar54,sVar53);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," <ROM path>",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    return 1;
  }
  CHIP8::CHIP8(&local_3884);
  CHIP8::initialise(&local_3884);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2038,argv[1],(allocator<char> *)local_38c0);
  bVar48 = CHIP8::loadROM(&local_3884,local_2038);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
    operator_delete(local_2038[0]._M_dataplus._M_p,local_2038[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar48) {
    iVar50 = SDL_Init(0xf231);
    if (iVar50 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Couldn\'t initialise SDL!\n",0x19);
      pcVar54 = (char *)SDL_GetError();
      poVar55 = std::operator<<((ostream *)&std::cerr,pcVar54);
      std::endl<char,std::char_traits<char>>(poVar55);
    }
    else {
      lVar56 = SDL_CreateWindow("CHIP8-Emulator",0x1fff0000,0x1fff0000,0x400,0x300,0x20);
      if (lVar56 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Couldn\'t create Window!\n",0x18);
        pcVar54 = (char *)SDL_GetError();
        poVar55 = std::operator<<((ostream *)&std::cerr,pcVar54);
        std::endl<char,std::char_traits<char>>(poVar55);
      }
      else {
        lVar56 = SDL_CreateRenderer(lVar56,0xffffffff,0);
        if (lVar56 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Couldn\'t create Renderer!\n",0x1a);
          pcVar54 = (char *)SDL_GetError();
          poVar55 = std::operator<<((ostream *)&std::cerr,pcVar54);
          std::endl<char,std::char_traits<char>>(poVar55);
        }
        else {
          lVar57 = SDL_CreateTexture(lVar56,0x16362004,1,0x40,0x20);
          if (lVar57 != 0) {
            uVar51 = SDL_GetTicks();
            uVar52 = SDL_GetTicks();
            uVar59 = (ulong)uVar52;
            lVar60 = 0;
            local_38d0 = (ulong)uVar51;
LAB_00102702:
            do {
              while( true ) {
                while (iVar50 = SDL_PollEvent(), iVar50 == 0) {
                  CHIP8::emulateCycle(&local_3884);
                  if (local_3884.drawFlag == true) {
                    iVar50 = SDL_LockTexture(lVar57,0,&local_38c8,&local_38d4);
                    if (iVar50 < 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Couldn\'t lock texture!\n",0x17);
                      pcVar54 = (char *)SDL_GetError();
                      poVar55 = std::operator<<((ostream *)&std::cerr,pcVar54);
                      std::endl<char,std::char_traits<char>>(poVar55);
                    }
                    lVar58 = 0;
                    do {
                      uVar51 = *(uint *)(local_3884.graphics + lVar58);
                      auVar23[0xc] = (char)(uVar51 >> 0x18);
                      auVar23._0_12_ = ZEXT712(0);
                      uVar37 = CONCAT32(auVar23._10_3_,(ushort)(byte)(uVar51 >> 0x10));
                      auVar42._5_8_ = 0;
                      auVar42._0_5_ = uVar37;
                      lVar1 = lVar58 * 4;
                      *(uint *)((long)&local_2038[0]._M_dataplus._M_p + lVar1) =
                           -(uVar51 & 0xff) | 0xff000000;
                      *(uint *)((long)&local_2038[0]._M_dataplus._M_p + lVar1 + 4) =
                           -(int)CONCAT72(SUB137(auVar42 << 0x40,6),(ushort)(byte)(uVar51 >> 8)) |
                           0xff000000;
                      *(uint *)((long)&local_2038[0]._M_string_length + lVar1) =
                           -(int)uVar37 | 0xff000000;
                      *(uint *)((long)&local_2038[0]._M_string_length + lVar1 + 4) =
                           -(uint)(uint3)(auVar23._10_3_ >> 0x10) | 0xff000000;
                      lVar58 = lVar58 + 4;
                    } while (lVar58 != 0x800);
                    memcpy(local_38c8,local_2038,(long)local_38d4 << 5);
                    SDL_UnlockTexture(lVar57);
                    SDL_RenderClear(lVar56);
                    SDL_RenderCopy(lVar56,lVar57,0,0);
                    SDL_RenderPresent(lVar56);
                    local_3884.drawFlag = false;
                    uVar51 = SDL_GetTicks();
                    if ((long)(uVar51 - uVar59) < 0x10) {
                      iVar50 = SDL_GetTicks();
                      SDL_Delay(((int)uVar59 - iVar50) + 0x10);
                    }
                    uVar51 = SDL_GetTicks();
                    uVar52 = SDL_GetTicks();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Avg. FPS: ",10);
                    fVar61 = (float)lVar60 / ((float)(long)(uVar52 - local_38d0) / 1000.0);
                    poVar55 = std::ostream::_M_insert<double>
                                        ((double)(float)(~-(uint)(2e+06 < fVar61) & (uint)fVar61));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar55,"\r",1);
                    uVar59 = (ulong)uVar51;
                    lVar60 = lVar60 + 1;
                  }
                  if (local_3884.beepFlag == true) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Beep!!                    \r",0x1b);
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                    local_3884.beepFlag = false;
                  }
                }
                uVar49 = SDLKeys[9];
                bVar66 = SDLKeys[0xc];
                if (local_38c0[0] != 0x300) break;
                if (local_38ac == 0x1b) goto LAB_00102c99;
                auVar5[0xd] = 0;
                auVar5._0_13_ = SDLKeys._0_13_;
                auVar5[0xe] = SDLKeys[7];
                auVar8[0xc] = SDLKeys[6];
                auVar8._0_12_ = SDLKeys._0_12_;
                auVar8._13_2_ = auVar5._13_2_;
                auVar12[0xb] = 0;
                auVar12._0_11_ = SDLKeys._0_11_;
                auVar12._12_3_ = auVar8._12_3_;
                uVar51 = auVar12._11_4_;
                auVar17[10] = SDLKeys[5];
                auVar17._0_10_ = SDLKeys._0_10_;
                auVar17._11_4_ = uVar51;
                auVar20[9] = 0;
                auVar20._0_9_ = SDLKeys._0_9_;
                auVar20._10_5_ = auVar17._10_5_;
                auVar22[8] = SDLKeys[4];
                auVar22._0_8_ = SDLKeys._0_8_;
                auVar22._9_6_ = auVar20._9_6_;
                auVar32._7_8_ = 0;
                auVar32._0_7_ = auVar22._8_7_;
                Var27 = CONCAT81(SUB158(auVar32 << 0x40,7),SDLKeys[3]);
                auVar40._9_6_ = 0;
                auVar40._0_9_ = Var27;
                auVar33._1_10_ = SUB1510(auVar40 << 0x30,5);
                auVar33[0] = SDLKeys[2];
                auVar41._11_4_ = 0;
                auVar41._0_11_ = auVar33;
                auVar34._1_12_ = SUB1512(auVar41 << 0x20,3);
                auVar34[0] = SDLKeys[1];
                uVar67 = CONCAT11(0,SDLKeys[0]);
                auVar25._2_13_ = auVar34;
                auVar25._0_2_ = uVar67;
                auVar6._10_2_ = 0;
                auVar6._0_10_ = auVar25._0_10_;
                auVar6._12_2_ = (short)Var27;
                uVar43 = CONCAT42(auVar6._10_4_,auVar33._0_2_);
                auVar35._6_8_ = 0;
                auVar35._0_6_ = uVar43;
                bVar48 = (uint)CONCAT82(SUB148(auVar35 << 0x40,6),auVar34._0_2_) == local_38ac;
                bVar2 = (uint)uVar43 == local_38ac;
                auVar46._4_4_ = -(uint)bVar2;
                auVar46._0_4_ = -(uint)bVar48;
                auVar46._8_4_ = -(uint)(auVar6._10_4_ >> 0x10 == local_38ac);
                if (uVar67 == local_38ac) {
                  local_3884.key[0] = '\x01';
                }
                if (bVar48) {
                  local_3884.key[1] = '\x01';
                }
                auVar74._12_4_ = 0;
                auVar74._0_12_ = auVar46 >> 0x10;
                if (bVar2) {
                  local_3884.key[2] = '\x01';
                }
                auVar72 = packsswb(auVar74,auVar74);
                if ((auVar72._0_4_ >> 0x18 & 1) != 0) {
                  local_3884.key[3] = '\x01';
                }
                uVar52 = -(uint)(auVar22._8_2_ == local_38ac);
                auVar70._0_8_ = CONCAT44(-(uint)(auVar17._10_2_ == local_38ac),uVar52);
                auVar70._8_4_ = -(uint)((uVar51 >> 8 & 0xffff) == local_38ac);
                auVar70._12_4_ = -(uint)(uVar51 >> 0x18 == local_38ac);
                if ((uVar52 & 1) != 0) {
                  local_3884.key[4] = '\x01';
                }
                auVar75._0_8_ = auVar70._0_8_ << 0x30;
                auVar75._8_8_ = auVar70._8_8_ << 0x30 | auVar70._0_8_ >> 0x10;
                auVar72 = packsswb(auVar75,auVar75);
                if ((auVar72._4_2_ >> 8 & 1) != 0) {
                  local_3884.key[5] = '\x01';
                }
                if ((auVar70._8_4_ & 1) != 0) {
                  local_3884.key[6] = '\x01';
                }
                if ((auVar70._11_2_ >> 8 & 1) != 0) {
                  local_3884.key[7] = '\x01';
                }
                uVar51 = CONCAT13(0,CONCAT12(uVar49,(ushort)SDLKeys[8]));
                auVar13[0xc] = SDLKeys[0xb];
                auVar13._0_12_ = ZEXT112(bVar66) << 0x40;
                auVar14._10_3_ = auVar13._10_3_;
                auVar14._0_10_ = (unkuint10)SDLKeys[10] << 0x40;
                auVar36._5_8_ = 0;
                auVar36._0_5_ = auVar14._8_5_;
                auVar18[4] = uVar49;
                auVar18._0_4_ = uVar51;
                auVar18[5] = 0;
                auVar18._6_7_ = SUB137(auVar36 << 0x40,6);
                bVar48 = auVar18._4_4_ == local_38ac;
                bVar2 = auVar14._8_4_ == local_38ac;
                auVar47._4_4_ = -(uint)bVar2;
                auVar47._0_4_ = -(uint)bVar48;
                auVar47._8_4_ = -(uint)((uint3)(auVar13._10_3_ >> 0x10) == local_38ac);
                if ((uVar51 & 0xffff) == local_38ac) {
                  local_3884.key[8] = '\x01';
                }
                if (bVar48) {
                  local_3884.key[9] = '\x01';
                }
                if (bVar2) {
                  local_3884.key[10] = '\x01';
                }
                auVar71._12_4_ = 0;
                auVar71._0_12_ = auVar47 >> 0x10;
                auVar72 = packsswb(auVar71,auVar71);
                if ((auVar72._10_2_ >> 8 & 1) != 0) {
                  local_3884.key[0xb] = '\x01';
                }
                auVar63._0_8_ =
                     CONCAT44(-(uint)(local_38ac == SDLKeys[0xd]),-(uint)(local_38ac == bVar66));
                auVar63._8_4_ = -(uint)(local_38ac == SDLKeys[0xe]);
                auVar63._12_4_ = -(uint)(local_38ac == SDLKeys[0xf]);
                if ((-(uint)(local_38ac == bVar66) & 1) != 0) {
                  local_3884.key[0xc] = '\x01';
                }
                auVar65._0_8_ = auVar63._0_8_ << 0x30;
                auVar65._8_8_ = auVar63._8_8_ << 0x30 | auVar63._0_8_ >> 0x10;
                auVar72 = packsswb(auVar65,auVar65);
                if ((auVar72._12_2_ >> 8 & 1) != 0) {
                  local_3884.key[0xd] = '\x01';
                }
                if ((auVar63._8_4_ & 1) != 0) {
                  local_3884.key[0xe] = '\x01';
                }
                uVar49 = '\x01';
                if (((ushort)((uint)auVar63._12_4_ >> 0x18) & 1) != 0) {
LAB_00102ac3:
                  local_3884.key[0xf] = uVar49;
                }
              }
              if (local_38c0[0] == 0x301) {
                auVar3[0xd] = 0;
                auVar3._0_13_ = SDLKeys._0_13_;
                auVar3[0xe] = SDLKeys[7];
                auVar7[0xc] = SDLKeys[6];
                auVar7._0_12_ = SDLKeys._0_12_;
                auVar7._13_2_ = auVar3._13_2_;
                auVar9[0xb] = 0;
                auVar9._0_11_ = SDLKeys._0_11_;
                auVar9._12_3_ = auVar7._12_3_;
                uVar51 = auVar9._11_4_;
                auVar15[10] = SDLKeys[5];
                auVar15._0_10_ = SDLKeys._0_10_;
                auVar15._11_4_ = uVar51;
                auVar19[9] = 0;
                auVar19._0_9_ = SDLKeys._0_9_;
                auVar19._10_5_ = auVar15._10_5_;
                auVar21[8] = SDLKeys[4];
                auVar21._0_8_ = SDLKeys._0_8_;
                auVar21._9_6_ = auVar19._9_6_;
                auVar26._7_8_ = 0;
                auVar26._0_7_ = auVar21._8_7_;
                Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),SDLKeys[3]);
                auVar38._9_6_ = 0;
                auVar38._0_9_ = Var27;
                auVar28._1_10_ = SUB1510(auVar38 << 0x30,5);
                auVar28[0] = SDLKeys[2];
                auVar39._11_4_ = 0;
                auVar39._0_11_ = auVar28;
                auVar29._1_12_ = SUB1512(auVar39 << 0x20,3);
                auVar29[0] = SDLKeys[1];
                uVar67 = CONCAT11(0,SDLKeys[0]);
                auVar24._2_13_ = auVar29;
                auVar24._0_2_ = uVar67;
                auVar4._10_2_ = 0;
                auVar4._0_10_ = auVar24._0_10_;
                auVar4._12_2_ = (short)Var27;
                uVar43 = CONCAT42(auVar4._10_4_,auVar28._0_2_);
                auVar30._6_8_ = 0;
                auVar30._0_6_ = uVar43;
                bVar48 = (uint)CONCAT82(SUB148(auVar30 << 0x40,6),auVar29._0_2_) == local_38ac;
                bVar2 = (uint)uVar43 == local_38ac;
                auVar44._4_4_ = -(uint)bVar2;
                auVar44._0_4_ = -(uint)bVar48;
                auVar44._8_4_ = -(uint)(auVar4._10_4_ >> 0x10 == local_38ac);
                if (uVar67 == local_38ac) {
                  local_3884.key[0] = '\0';
                }
                if (bVar48) {
                  local_3884.key[1] = '\0';
                }
                auVar72._12_4_ = 0;
                auVar72._0_12_ = auVar44 >> 0x10;
                if (bVar2) {
                  local_3884.key[2] = '\0';
                }
                auVar72 = packsswb(auVar72,auVar72);
                if ((auVar72._0_4_ >> 0x18 & 1) != 0) {
                  local_3884.key[3] = '\0';
                }
                uVar52 = -(uint)(auVar21._8_2_ == local_38ac);
                auVar68._0_8_ = CONCAT44(-(uint)(auVar15._10_2_ == local_38ac),uVar52);
                auVar68._8_4_ = -(uint)((uVar51 >> 8 & 0xffff) == local_38ac);
                auVar68._12_4_ = -(uint)(uVar51 >> 0x18 == local_38ac);
                if ((uVar52 & 1) != 0) {
                  local_3884.key[4] = '\0';
                }
                auVar73._0_8_ = auVar68._0_8_ << 0x30;
                auVar73._8_8_ = auVar68._8_8_ << 0x30 | auVar68._0_8_ >> 0x10;
                auVar72 = packsswb(auVar73,auVar73);
                if ((auVar72._4_2_ >> 8 & 1) != 0) {
                  local_3884.key[5] = '\0';
                }
                if ((auVar68._8_4_ & 1) != 0) {
                  local_3884.key[6] = '\0';
                }
                if ((auVar68._11_2_ >> 8 & 1) != 0) {
                  local_3884.key[7] = '\0';
                }
                uVar51 = CONCAT13(0,CONCAT12(uVar49,(ushort)SDLKeys[8]));
                auVar10[0xc] = SDLKeys[0xb];
                auVar10._0_12_ = ZEXT112(bVar66) << 0x40;
                auVar11._10_3_ = auVar10._10_3_;
                auVar11._0_10_ = (unkuint10)SDLKeys[10] << 0x40;
                auVar31._5_8_ = 0;
                auVar31._0_5_ = auVar11._8_5_;
                auVar16[4] = uVar49;
                auVar16._0_4_ = uVar51;
                auVar16[5] = 0;
                auVar16._6_7_ = SUB137(auVar31 << 0x40,6);
                bVar48 = auVar16._4_4_ == local_38ac;
                bVar2 = auVar11._8_4_ == local_38ac;
                auVar45._4_4_ = -(uint)bVar2;
                auVar45._0_4_ = -(uint)bVar48;
                auVar45._8_4_ = -(uint)((uint3)(auVar10._10_3_ >> 0x10) == local_38ac);
                if ((uVar51 & 0xffff) == local_38ac) {
                  local_3884.key[8] = '\0';
                }
                if (bVar48) {
                  local_3884.key[9] = '\0';
                }
                if (bVar2) {
                  local_3884.key[10] = '\0';
                }
                auVar69._12_4_ = 0;
                auVar69._0_12_ = auVar45 >> 0x10;
                auVar72 = packsswb(auVar69,auVar69);
                if ((auVar72._10_2_ >> 8 & 1) != 0) {
                  local_3884.key[0xb] = '\0';
                }
                auVar62._0_8_ =
                     CONCAT44(-(uint)(local_38ac == SDLKeys[0xd]),-(uint)(local_38ac == bVar66));
                auVar62._8_4_ = -(uint)(local_38ac == SDLKeys[0xe]);
                auVar62._12_4_ = -(uint)(local_38ac == SDLKeys[0xf]);
                if ((-(uint)(local_38ac == bVar66) & 1) != 0) {
                  local_3884.key[0xc] = '\0';
                }
                auVar64._0_8_ = auVar62._0_8_ << 0x30;
                auVar64._8_8_ = auVar62._8_8_ << 0x30 | auVar62._0_8_ >> 0x10;
                auVar72 = packsswb(auVar64,auVar64);
                if ((auVar72._12_2_ >> 8 & 1) != 0) {
                  local_3884.key[0xd] = '\0';
                }
                if ((auVar62._8_4_ & 1) != 0) {
                  local_3884.key[0xe] = '\0';
                }
                if (((ushort)((uint)auVar62._12_4_ >> 0x18) & 1) != 0) {
                  uVar49 = '\0';
                  goto LAB_00102ac3;
                }
                goto LAB_00102702;
              }
              if (local_38c0[0] == 0x100) {
LAB_00102c99:
                exit(0);
              }
            } while( true );
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Couldn\'t create texture!\n",0x19);
          pcVar54 = (char *)SDL_GetError();
          poVar55 = std::operator<<((ostream *)&std::cerr,pcVar54);
          std::endl<char,std::char_traits<char>>(poVar55);
        }
      }
    }
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv){

    if(argc < 2){
        std::cerr << "No ROM specified!\nUsage:\t" << argv[0] << " <ROM path>" << std::endl;
        return 1;
    }

    CHIP8 emulator;

    emulator.initialise();

    if (!emulator.loadROM(argv[1])){
        exit(1);
    }

    SDL_Window   *window   = NULL;
    SDL_Renderer *renderer = NULL;
    SDL_Texture  *texture  = NULL;

    if (SDL_Init(SDL_INIT_EVERYTHING) < 0){
        std::cerr << "Couldn't initialise SDL!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    window = SDL_CreateWindow("CHIP8-Emulator",
                SDL_WINDOWPOS_UNDEFINED,
                SDL_WINDOWPOS_UNDEFINED,
                WINDOW_WIDTH, WINDOW_HEIGHT,
                SDL_WINDOW_RESIZABLE);

    if (window == NULL){
        std::cerr << "Couldn't create Window!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    renderer = SDL_CreateRenderer(window, -1, 0);

    if (renderer == NULL){
        std::cerr << "Couldn't create Renderer!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    texture = SDL_CreateTexture(renderer,
                    SDL_PIXELFORMAT_ARGB8888,
                    SDL_TEXTUREACCESS_STREAMING,
                    GRAPHICS_WIDTH, GRAPHICS_HEIGHT);

    if(texture == NULL){
        std::cerr << "Couldn't create texture!\n" << SDL_GetError() << std::endl;
        exit(1);
    }

    unsigned int pixels[GRAPHICS_HEIGHT * GRAPHICS_WIDTH];
    int  timer = 0;
    long start = SDL_GetTicks(); // For measuring average FPS
    long start_per_frame = SDL_GetTicks(); // For capping FPS
    long countedFrames = 0;

    while(true){

        SDL_Event event;

        while(SDL_PollEvent(&event)) {
            if (event.type == SDL_QUIT)
                exit(0);

            if (event.type == SDL_KEYDOWN){
                if (event.key.keysym.sym == SDLK_ESCAPE)
                    exit(0);

                for (int i = 0; i < TOTAL_KEYS; ++i){
                    if (event.key.keysym.sym == SDLKeys[i]){
                        emulator.key[i] = 1;
                    }
                }
            }

            if (event.type == SDL_KEYUP){
                for (int i = 0; i < TOTAL_KEYS; ++i){
                    if (event.key.keysym.sym == SDLKeys[i]){
                        emulator.key[i] = 0;
                    }
                }
            }
        }

        if (timer == CLOCK_DELAYER){
            emulator.emulateCycle();
            timer = 0;
        }

        else {
            timer += 1;
        }


        int pitch;
        void* m_pixels;


        if (emulator.drawFlag){

            if(SDL_LockTexture(texture, NULL, (void **)&m_pixels, &pitch) < 0){
                std::cerr << "Couldn't lock texture!\n" << SDL_GetError() << std::endl;
            }

            for (int i = 0; i < (GRAPHICS_HEIGHT * GRAPHICS_WIDTH); ++i){
                pixels[i] = ((0x00FFFFFF *  emulator.graphics[i]) | 0xFF000000);
            }

            memcpy(m_pixels, pixels, GRAPHICS_HEIGHT*pitch);
            SDL_UnlockTexture(texture);

            SDL_RenderClear(renderer);
            SDL_RenderCopy(renderer,texture,NULL,NULL);
            SDL_RenderPresent(renderer);


            emulator.drawFlag = false;

            if((1000 / FPS_CAP) > (SDL_GetTicks() - start_per_frame)){
                SDL_Delay( (1000 / FPS_CAP) - (SDL_GetTicks() - start_per_frame));
            }
            start_per_frame = SDL_GetTicks();
            float avgFPS = countedFrames / ( (SDL_GetTicks() - start) / 1000.f );
			if( avgFPS > 2000000 ){
				avgFPS = 0;
			}
            ++countedFrames;

            std::cerr << "Avg. FPS: " << avgFPS << "\r";
        }
        if (emulator.beepFlag){
            std::cerr << "Beep!!                    \r" << std::endl;
            //TODO

            emulator.beepFlag = false;
        }

    }

    return 0;
}